

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppression::NonMaximumSuppression(NonMaximumSuppression *this)

{
  NonMaximumSuppression *pNVar1;
  NonMaximumSuppression *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NonMaximumSuppression_00574908;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  SuppressionMethodUnion::SuppressionMethodUnion
            ((SuppressionMethodUnion *)&this->SuppressionMethod_);
  ClassLabelsUnion::ClassLabelsUnion((ClassLabelsUnion *)&this->ClassLabels_);
  pNVar1 = internal_default_instance();
  if (this != pNVar1) {
    protobuf_NonMaximumSuppression_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

NonMaximumSuppression::NonMaximumSuppression()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NonMaximumSuppression_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.NonMaximumSuppression)
}